

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_NewClass(JSRuntime *rt,JSClassID class_id,JSClassDef *class_def)

{
  int iVar1;
  char *__s;
  JSAtomStruct *p;
  uint name;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  
  __s = class_def->class_name;
  sVar3 = strlen(__s);
  name = __JS_FindAtom(rt,__s,(long)(int)sVar3,in_ECX);
  if ((name == 0) && (name = __JS_NewAtomInit(rt,class_def->class_name,(int)sVar3,1), name == 0)) {
    return -1;
  }
  iVar2 = JS_NewClass1(rt,class_id,class_def,name);
  if (0xd1 < (int)name) {
    p = rt->atom_array[name];
    iVar1 = (p->header).ref_count;
    (p->header).ref_count = iVar1 + -1;
    if (iVar1 < 2) {
      JS_FreeAtomStruct(rt,p);
    }
  }
  return iVar2;
}

Assistant:

int JS_NewClass(JSRuntime *rt, JSClassID class_id, const JSClassDef *class_def)
{
    int ret, len;
    JSAtom name;

    len = strlen(class_def->class_name);
    name = __JS_FindAtom(rt, class_def->class_name, len, JS_ATOM_TYPE_STRING);
    if (name == JS_ATOM_NULL) {
        name = __JS_NewAtomInit(rt, class_def->class_name, len, JS_ATOM_TYPE_STRING);
        if (name == JS_ATOM_NULL)
            return -1;
    }
    ret = JS_NewClass1(rt, class_id, class_def, name);
    JS_FreeAtomRT(rt, name);
    return ret;
}